

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Glucose::SimpSolver::addClause_(SimpSolver *this,vec<Glucose::Lit> *ps)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Lit LVar6;
  Lit *pLVar7;
  Clause *this_00;
  Heap<Glucose::SimpSolver::ElimLt> *this_01;
  int *piVar8;
  char *pcVar9;
  uchar *puVar10;
  size_t *siglen;
  size_t *siglen_00;
  vec<Glucose::Lit> *in_RSI;
  uchar *puVar11;
  long in_RDI;
  size_t in_R8;
  int i_2;
  Clause *c;
  CRef cr;
  int i_1;
  int i;
  int nclauses;
  vec<Glucose::Lit> *in_stack_00000150;
  Solver *in_stack_00000158;
  undefined4 in_stack_ffffffffffffff48;
  Ref in_stack_ffffffffffffff4c;
  Solver *in_stack_ffffffffffffff50;
  vec<Glucose::Lit> *in_stack_ffffffffffffff80;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  int local_44;
  uint local_2c;
  uint local_20;
  bool local_1;
  
  iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x208));
  if (((*(byte *)(in_RDI + 0x4c1) & 1) == 0) ||
     (bVar1 = implied((SimpSolver *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      in_stack_ffffffffffffff80), !bVar1)) {
    bVar1 = Solver::addClause_(in_stack_00000158,in_stack_00000150);
    if (bVar1) {
      if ((*(int *)(in_RDI + 0x4a8) == 0) && ((*(byte *)(in_RDI + 0xc0) & 1) != 0)) {
        if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
          local_2c = 0;
          while( true ) {
            in_stack_ffffffffffffff8c = local_2c;
            uVar3 = vec<Glucose::Lit>::size(in_RSI);
            puVar10 = (uchar *)(ulong)uVar3;
            if ((int)uVar3 <= (int)in_stack_ffffffffffffff8c) break;
            __stream = *(FILE **)(in_RDI + 0xb8);
            pLVar7 = vec<Glucose::Lit>::operator[](in_RSI,local_2c);
            iVar4 = var((Lit)pLVar7->x);
            puVar11 = (uchar *)(ulong)local_2c;
            pLVar7 = vec<Glucose::Lit>::operator[](in_RSI,local_2c);
            iVar5 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar11,siglen_00,puVar10,in_R8);
            fprintf(__stream,"%i ",(ulong)((iVar4 + 1) * ((uint)((byte)iVar5 & 1) * -2 + 1)));
            local_2c = local_2c + 1;
          }
          fprintf(*(FILE **)(in_RDI + 0xb8),"0\n");
        }
        else {
          Solver::write_char(in_stack_ffffffffffffff50,(uchar)(in_stack_ffffffffffffff4c >> 0x18));
          local_20 = 0;
          while( true ) {
            in_stack_ffffffffffffff94 = local_20;
            uVar3 = vec<Glucose::Lit>::size(in_RSI);
            puVar10 = (uchar *)(ulong)uVar3;
            if ((int)uVar3 <= (int)in_stack_ffffffffffffff94) break;
            pLVar7 = vec<Glucose::Lit>::operator[](in_RSI,local_20);
            iVar4 = var((Lit)pLVar7->x);
            in_stack_ffffffffffffff90 = (iVar4 + 1) * 2;
            puVar11 = (uchar *)(ulong)local_20;
            pLVar7 = vec<Glucose::Lit>::operator[](in_RSI,local_20);
            sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,puVar11,siglen,puVar10,in_R8);
            Solver::write_lit(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
            local_20 = local_20 + 1;
          }
          Solver::write_lit(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        }
      }
      if (((*(byte *)(in_RDI + 0x4d0) & 1) != 0) &&
         (iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x208)), iVar4 == iVar2 + 1
         )) {
        vec<unsigned_int>::last((vec<unsigned_int> *)(in_RDI + 0x208));
        this_00 = ClauseAllocator::operator[]
                            ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
        ;
        Queue<unsigned_int>::insert
                  ((Queue<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
        for (local_44 = 0; iVar2 = Clause::size(this_00), local_44 < iVar2; local_44 = local_44 + 1)
        {
          iVar4 = (int)((ulong)(in_RDI + 0x4f8) >> 0x20);
          LVar6 = Clause::operator[](this_00,local_44);
          var(LVar6);
          OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::operator[]
                    ((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
                      *)in_stack_ffffffffffffff50,
                     (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          vec<unsigned_int>::push
                    ((vec<unsigned_int> *)in_stack_ffffffffffffff50,
                     (uint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          this_01 = (Heap<Glucose::SimpSolver::ElimLt> *)(in_RDI + 0x530);
          LVar6 = Clause::operator[](this_00,local_44);
          iVar2 = toInt(LVar6);
          piVar8 = vec<int>::operator[]((vec<int> *)this_01,iVar2);
          *piVar8 = *piVar8 + 1;
          LVar6 = Clause::operator[](this_00,local_44);
          iVar2 = var(LVar6);
          pcVar9 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x4e8),iVar2);
          *pcVar9 = '\x01';
          *(int *)(in_RDI + 0x5a4) = *(int *)(in_RDI + 0x5a4) + 1;
          LVar6 = Clause::operator[](this_00,local_44);
          var(LVar6);
          bVar1 = Heap<Glucose::SimpSolver::ElimLt>::inHeap(this_01,iVar4);
          if (bVar1) {
            in_stack_ffffffffffffff50 = (Solver *)(in_RDI + 0x540);
            LVar6 = Clause::operator[](this_00,local_44);
            var(LVar6);
            Heap<Glucose::SimpSolver::ElimLt>::increase
                      ((Heap<Glucose::SimpSolver::ElimLt> *)in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff4c);
          }
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif
    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if(!parsing && certifiedUNSAT) {
        if (vbyte) {
            write_char('a');
            for (int i = 0; i < ps.size(); i++)
                write_lit(2*(var(ps[i])+1) + sign(ps[i]));
            write_lit(0);
        }
        else {
            for (int i = 0; i < ps.size(); i++)
                fprintf(certifiedOutput, "%i " , (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1) );
            fprintf(certifiedOutput, "0\n");
        }
    }

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[toInt(c[i])]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}